

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O2

void __thiscall
myvk::CommandBuffer::CmdBindDescriptorSets
          (CommandBuffer *this,
          vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
          *descriptor_sets,uint32_t first_set,Ptr<PipelineLayout> *pipeline_layout,
          VkPipelineBindPoint pipeline_bind_point,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *offsets)

{
  uint32_t *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_49;
  vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_> handles;
  
  std::vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::vector
            (&handles,(long)(descriptor_sets->
                            super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(descriptor_sets->
                            super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4,&local_49);
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    uVar4 = (long)handles.
                  super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)handles.
                  super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar4 <= uVar3) break;
    handles.super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] =
         ((descriptor_sets->
          super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar3].
          super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_descriptor_set;
    uVar2 = uVar2 + 1;
  }
  puVar1 = (offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (*vkCmdBindDescriptorSets)
            (this->m_command_buffer,pipeline_bind_point,
             ((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->m_pipeline_layout,first_set,(uint32_t)uVar4,
             handles.super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (uint32_t)
             ((ulong)((long)(offsets->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar1) >> 2),puVar1);
  std::_Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::~_Vector_base
            (&handles.super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>)
  ;
  return;
}

Assistant:

void CommandBuffer::CmdBindDescriptorSets(const std::vector<Ptr<DescriptorSet>> &descriptor_sets, uint32_t first_set,
                                          const Ptr<PipelineLayout> &pipeline_layout,
                                          VkPipelineBindPoint pipeline_bind_point,
                                          const std::vector<uint32_t> &offsets) const {
	std::vector<VkDescriptorSet> handles(descriptor_sets.size());
	for (uint32_t i = 0; i < handles.size(); ++i)
		handles[i] = descriptor_sets[i]->GetHandle();

	vkCmdBindDescriptorSets(m_command_buffer, pipeline_bind_point, pipeline_layout->GetHandle(), first_set,
	                        handles.size(), handles.data(), offsets.size(), offsets.data());
}